

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuaranteedThroughputProbabilisticSampler.cpp
# Opt level: O1

void __thiscall
jaegertracing::samplers::GuaranteedThroughputProbabilisticSampler::update
          (GuaranteedThroughputProbabilisticSampler *this,double lowerBound,double samplingRate)

{
  RateLimitingSampler *pRVar1;
  RateLimitingSampler *this_00;
  long lVar2;
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  *this_01;
  undefined1 local_108 [32];
  char *local_e8;
  long local_e0;
  char local_d8 [16];
  double local_c8;
  undefined1 local_c0 [40];
  pointer local_98;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  local_58;
  
  if ((this->_samplingRate != samplingRate) || (NAN(this->_samplingRate) || NAN(samplingRate))) {
    ProbabilisticSampler::ProbabilisticSampler((ProbabilisticSampler *)local_c0,samplingRate);
    (this->_probabilisticSampler)._samplingRate = (double)local_c0._8_8_;
    (this->_probabilisticSampler)._samplingBoundary = local_c0._16_8_;
    local_108._0_8_ =
         (this->_probabilisticSampler)._tags.
         super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_108._8_8_ =
         (this->_probabilisticSampler)._tags.
         super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_108._16_8_ =
         (this->_probabilisticSampler)._tags.
         super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (this->_probabilisticSampler)._tags.
    super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_c0._24_8_;
    (this->_probabilisticSampler)._tags.
    super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_c0._32_8_;
    (this->_probabilisticSampler)._tags.
    super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_98;
    local_c0._24_8_ = (pointer)0x0;
    local_c0._32_8_ = (pointer)0x0;
    local_98 = (pointer)0x0;
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
              ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_108);
    local_c0._0_8_ = &PTR__ProbabilisticSampler_00274b50;
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
              ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(local_c0 + 0x18))
    ;
    this->_samplingRate = (this->_probabilisticSampler)._samplingRate;
    local_108._0_8_ = (pointer)(local_108 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"sampler.type","");
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c0,local_108._0_8_,
               (undefined1 *)
               ((long)&(((string *)local_108._8_8_)->_M_dataplus)._M_p + local_108._0_8_));
    local_e8 = "lowerbound";
    opentracing::v3::util::
    variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
    ::
    variant<char_const*&,opentracing::v3::util::detail::value_traits<char_const*&,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
              ((variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
                *)(local_c0 + 0x20),&local_e8);
    local_e8 = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"sampler.param","");
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char*>((string *)local_78,local_e8,local_e8 + local_e0);
    this_01 = &local_58;
    local_c8 = this->_samplingRate;
    opentracing::v3::util::
    variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
    ::
    variant<double,opentracing::v3::util::detail::value_traits<double,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
              (this_01,&local_c8);
    std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
    _M_assign_aux<jaegertracing::Tag_const*>
              ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>> *)&this->_tags,
               local_c0,&stack0xffffffffffffffd0);
    lVar2 = -0x90;
    do {
      opentracing::v3::util::
      variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
      ::~variant(this_01);
      if ((anon_struct_8_0_00000001_for___align)((long)&this_01[-1].data + 0x10) !=
          this_01[-1].data.__align) {
        operator_delete((void *)this_01[-1].data.__align);
      }
      this_01 = (variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
                 *)&this_01[-2].data;
      lVar2 = lVar2 + 0x48;
    } while (lVar2 != 0);
    if (local_e8 != local_d8) {
      operator_delete(local_e8);
    }
    if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_);
    }
  }
  if ((this->_lowerBound != lowerBound) || (NAN(this->_lowerBound) || NAN(lowerBound))) {
    this_00 = (RateLimitingSampler *)operator_new(0x70);
    RateLimitingSampler::RateLimitingSampler(this_00,lowerBound);
    pRVar1 = (this->_lowerBoundSampler)._M_t.
             super___uniq_ptr_impl<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
             .super__Head_base<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_false>.
             _M_head_impl;
    (this->_lowerBoundSampler)._M_t.
    super___uniq_ptr_impl<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
    ._M_t.
    super__Tuple_impl<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
    .super__Head_base<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_false>._M_head_impl =
         this_00;
    if (pRVar1 != (RateLimitingSampler *)0x0) {
      (*(pRVar1->super_Sampler)._vptr_Sampler[1])();
    }
    this->_lowerBound = lowerBound;
  }
  return;
}

Assistant:

void GuaranteedThroughputProbabilisticSampler::update(double lowerBound,
                                                      double samplingRate)
{
    if (_samplingRate != samplingRate) {
        _probabilisticSampler = ProbabilisticSampler(samplingRate);
        _samplingRate = _probabilisticSampler.samplingRate();
        _tags = { { kSamplerTypeTagKey, kSamplerTypeLowerBound },
                  { kSamplerParamTagKey, _samplingRate } };
    }

    if (_lowerBound != lowerBound) {
        _lowerBoundSampler.reset(new RateLimitingSampler(lowerBound));
        _lowerBound = lowerBound;
    }
}